

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

string * escape_string(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  char cVar4;
  allocator local_71;
  string local_70 [55];
  char local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator it;
  char *hex_digits;
  string *s_local;
  string *result;
  
  it._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_38._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    local_39 = *pcVar3;
    if (local_39 == '\\') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
    }
    else if (local_39 == '\'') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\'");
    }
    else if (local_39 == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
    }
    else if (local_39 == '\b') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
    }
    else if (local_39 == '\t') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
    }
    else if (local_39 == '\r') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
    }
    else if (local_39 == '\n') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
    }
    else {
      iVar2 = isprint((int)local_39);
      cVar4 = local_39;
      if (iVar2 == 0) {
        cVar4 = (char)__return_storage_ptr__;
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::push_back(cVar4);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,1,cVar4,&local_71);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_70);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_string(const std::string &s) {
    const char *hex_digits = "0123456789abcdef";
    std::string result;

    for (auto it = s.begin(); it != s.end(); ++it) {
        char ch = *it;

        if (ch == '\\') {
            result += "\\\\";
        } else if (ch == '\'') {
            result += "\\\'";
        } else if (ch == '\"') {
            result += "\\\"";
        } else if (ch == '\b') {
            result += "\\b";
        } else if (ch == '\t') {
            result += "\\t";
        } else if (ch == '\r') {
            result += "\\r";
        } else if (ch == '\n') {
            result += "\\n";
        } else if (std::isprint(ch)) {
            result += std::string(1, ch);
        } else {
            result.push_back('\\');
            result.push_back('x');
            result.push_back(hex_digits[static_cast<unsigned char>(ch) / 16]);
            result.push_back(hex_digits[static_cast<unsigned char>(ch) % 16]);
        }
    }

    return result;
}